

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightredis.cpp
# Opt level: O1

int main(void)

{
  epoll_data_t *__addr;
  int __fd;
  undefined1 local_5f8 [8];
  reactor react;
  sockaddr_in servaddr;
  int epollfd;
  
  __fd = socket(2,1,0);
  if (__fd != -1) {
    __addr = &react.events[99].data;
    bzero(__addr,0x10);
    react.events[99].data.ptr = (void *)0x95260002;
    bind(__fd,(sockaddr *)__addr,0x10);
  }
  listen(__fd,0x400);
  reactor::reactor((reactor *)local_5f8,(int *)(servaddr.sin_zero + 4),__fd);
  servaddr.sin_zero[0] = 0xff;
  servaddr.sin_zero[1] = 0xff;
  servaddr.sin_zero[2] = 0xff;
  servaddr.sin_zero[3] = 0xff;
  reactor::reactor_listen((reactor *)local_5f8,(int *)servaddr.sin_zero);
  close(servaddr.sin_zero._4_4_);
  if (react.cv.cm.field_2._8_8_ != 0) {
    operator_delete((void *)react.cv.cm.field_2._8_8_);
  }
  if ((size_type *)react.cv.tmpit._M_current != &react.cv.cm._M_string_length) {
    operator_delete(react.cv.tmpit._M_current);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&react.cv.rcommandmp._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&react.cv.commandmp._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)&react.clibuf._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&react.clifd);
  return 0;
}

Assistant:

int main(){
      int epollfd,listenfd;
      struct sockaddr_in servaddr;

      listenfd=socket(AF_INET,SOCK_STREAM,0);

      if(listenfd!=-1){
            bzero(&servaddr,sizeof(servaddr));
            servaddr.sin_family=AF_INET;
            servaddr.sin_port=htons(9877);
            servaddr.sin_addr.s_addr=htonl(INADDR_ANY);

            bind(listenfd,(struct sockaddr *)&servaddr,sizeof(servaddr));
      }

      listen(listenfd,1024);//backlog

      reactor react(epollfd,listenfd);
      //react.aof();
      react.reactor_listen(-1);

      close(epollfd);
}